

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ElementSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,int32_t index,ASTContext *context)

{
  bool bVar1;
  Type *args;
  ElementSelectExpression *this;
  Expression *pEVar2;
  Expression *indexExpr;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  Expression *local_30;
  
  SVInt::SVInt<int>((SVInt *)&local_40,index);
  local_30 = IntegerLiteral::fromConstant(compilation,(SVInt *)&local_40);
  if (((0x40 < local_38) || ((local_33 & 1) != 0)) && ((void *)local_40.val != (void *)0x0)) {
    operator_delete__(local_40.pVal);
  }
  Expression::selfDetermined(context,&local_30);
  args = getIndexedType(compilation,context,(value->type).ptr,local_30->sourceRange,
                        value->sourceRange,false);
  this = BumpAllocator::
         emplace<slang::ast::ElementSelectExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,args,value,local_30,&value->sourceRange);
  bVar1 = Expression::bad(value);
  if (((!bVar1) && (bVar1 = Expression::bad(local_30), !bVar1)) &&
     (bVar1 = Expression::bad(&this->super_Expression), !bVar1)) {
    return &this->super_Expression;
  }
  pEVar2 = Expression::badExpr(compilation,&this->super_Expression);
  return pEVar2;
}

Assistant:

Expression& ElementSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                  int32_t index, const ASTContext& context) {
    Expression* indexExpr = &IntegerLiteral::fromConstant(compilation, index);
    selfDetermined(context, indexExpr);

    const Type& resultType = getIndexedType(compilation, context, *value.type,
                                            indexExpr->sourceRange, value.sourceRange, false);

    auto result = compilation.emplace<ElementSelectExpression>(resultType, value, *indexExpr,
                                                               value.sourceRange);
    if (value.bad() || indexExpr->bad() || result->bad())
        return badExpr(compilation, result);

    return *result;
}